

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

void __thiscall
cmVirtualDirectoryWatcher::AddChildWatcher
          (cmVirtualDirectoryWatcher *this,string *ps,cmIBaseWatcher *watcher)

{
  byte bVar1;
  bool bVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>
  local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
  local_28;
  cmIBaseWatcher *local_20;
  cmIBaseWatcher *watcher_local;
  string *ps_local;
  cmVirtualDirectoryWatcher *this_local;
  
  local_20 = watcher;
  watcher_local = (cmIBaseWatcher *)ps;
  ps_local = (string *)this;
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!ps.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFileMonitor.cxx"
                  ,0x6b,
                  "void cmVirtualDirectoryWatcher::AddChildWatcher(const std::string &, cmIBaseWatcher *)"
                 );
  }
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>_>
       ::find(&this->Children,(key_type *)watcher_local);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>_>
       ::end(&this->Children);
  bVar2 = std::__detail::operator==(&local_28,&local_30);
  if (!bVar2) {
    __assert_fail("this->Children.find(ps) == this->Children.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFileMonitor.cxx"
                  ,0x6c,
                  "void cmVirtualDirectoryWatcher::AddChildWatcher(const std::string &, cmIBaseWatcher *)"
                 );
  }
  if (local_20 != (cmIBaseWatcher *)0x0) {
    std::make_pair<std::__cxx11::string_const&,cmIBaseWatcher*&>
              (&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)watcher_local,
               &local_20);
    std::
    unordered_map<std::__cxx11::string,cmIBaseWatcher*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmIBaseWatcher*>>>
    ::emplace<std::pair<std::__cxx11::string,cmIBaseWatcher*>>
              ((unordered_map<std::__cxx11::string,cmIBaseWatcher*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmIBaseWatcher*>>>
                *)&this->Children,&local_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>
    ::~pair(&local_58);
    return;
  }
  __assert_fail("watcher",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFileMonitor.cxx"
                ,0x6d,
                "void cmVirtualDirectoryWatcher::AddChildWatcher(const std::string &, cmIBaseWatcher *)"
               );
}

Assistant:

void AddChildWatcher(const std::string& ps, cmIBaseWatcher* watcher)
  {
    assert(!ps.empty());
    assert(this->Children.find(ps) == this->Children.end());
    assert(watcher);

    this->Children.emplace(std::make_pair(ps, watcher));
  }